

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

unsigned_long __thiscall RPCHelpMan::Arg<unsigned_long>(RPCHelpMan *this,string_view key)

{
  long lVar1;
  size_t i;
  uint64_t uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  i = GetParamIndex(this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    uVar2 = ArgValue<unsigned_long>(this,i);
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

auto Arg(std::string_view key) const
    {
        auto i{GetParamIndex(key)};
        // Return argument (required or with default value).
        if constexpr (std::is_integral_v<R> || std::is_floating_point_v<R>) {
            // Return numbers by value.
            return ArgValue<R>(i);
        } else {
            // Return everything else by reference.
            return ArgValue<const R&>(i);
        }
    }